

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Data_PDU::Minefield_Data_PDU(Minefield_Data_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Minefield_Data_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Data_PDU_0032fff0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTyp);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16SensorTypes);
  std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::vector
            (&this->m_vMines);
  (*(this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Minefield_Data_PDU::Minefield_Data_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}